

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O1

string * spvTargetEnvList_abi_cxx11_(string *__return_storage_ptr__,int pad,int wrap)

{
  long lVar1;
  ulong uVar2;
  string line;
  string sep;
  string word;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  undefined1 *local_c0;
  ulong local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  long *local_a0;
  char *local_98;
  long local_90 [2];
  ulong local_80;
  long local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar1 = 0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = (ulong)(wrap - pad);
  local_c0 = &local_b0;
  local_b8 = 0;
  local_b0 = 0;
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  local_78 = (long)pad;
  local_80 = (ulong)wrap;
  do {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_a0,local_98 + (long)local_a0);
    std::__cxx11::string::append((char *)&local_70);
    if (uVar2 < local_68 + local_b8) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>((string *)local_50,local_c0,local_c0 + local_b8);
      std::__cxx11::string::append((char *)local_50);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      std::__cxx11::string::_M_replace_aux((ulong)&local_c0,0,local_b8,(char)local_78);
      uVar2 = local_80;
    }
    std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_70);
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,local_98,0x752f01);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x1a0);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0);
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string spvTargetEnvList(const int pad, const int wrap) {
  std::string ret;
  size_t max_line_len = wrap - pad;  // The first line isn't padded
  std::string line;
  std::string sep = "";

  for (auto& name_env : spvTargetEnvNameMap) {
    std::string word = sep + name_env.first;
    if (line.length() + word.length() > max_line_len) {
      // Adding one word wouldn't fit, commit the line in progress and
      // start a new one.
      ret += line + "\n";
      line.assign(pad, ' ');
      // The first line is done. The max length now comprises the
      // padding.
      max_line_len = wrap;
    }
    line += word;
    sep = "|";
  }

  ret += line;

  return ret;
}